

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

int mbedtls_sha256_update(mbedtls_sha256_context *ctx,uchar *input,size_t ilen)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uchar *data;
  size_t __n;
  ulong uStack_38;
  
  if (ilen == 0) {
    iVar3 = 0;
  }
  else {
    uVar1 = ctx->total[0];
    uVar2 = uVar1 & 0x3f;
    ctx->total[0] = (uint)ilen + uVar1;
    if (CARRY4((uint)ilen,uVar1)) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    if (uVar2 == 0) {
      uStack_38 = 0;
    }
    else {
      uVar4 = 0x40 - (ulong)uVar2;
      if (ilen < uVar4) {
        uStack_38 = ((ulong)uVar1 & 0x3f) << 0x20;
      }
      else {
        uStack_38 = 0;
        switchD_0193dc74::default(ctx->buffer + uVar2,input,uVar4);
        mbedtls_internal_sha256_process(ctx,ctx->buffer);
        input = input + uVar4;
        ilen = ilen - uVar4;
      }
    }
    __n = ilen;
    do {
      if (__n < 0x40) {
        if (__n == 0) {
          return 0;
        }
        switchD_0193dc74::default(ctx->buffer + (uStack_38 >> 0x20),input,__n);
        return 0;
      }
      uVar4 = __n & 0xffffffffffffffc0;
      data = input;
      for (; 0x3f < __n; __n = __n - 0x40) {
        mbedtls_internal_sha256_process(ctx,data);
        data = data + 0x40;
      }
      input = input + uVar4;
      __n = (ulong)((uint)ilen & 0x3f);
    } while (uVar4 != 0);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int mbedtls_sha256_update(mbedtls_sha256_context *ctx,
                          const unsigned char *input,
                          size_t ilen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t fill;
    uint32_t left;

    if (ilen == 0) {
        return 0;
    }

    left = ctx->total[0] & 0x3F;
    fill = SHA256_BLOCK_SIZE - left;

    ctx->total[0] += (uint32_t) ilen;
    ctx->total[0] &= 0xFFFFFFFF;

    if (ctx->total[0] < (uint32_t) ilen) {
        ctx->total[1]++;
    }

    if (left && ilen >= fill) {
        memcpy((void *) (ctx->buffer + left), input, fill);

        if ((ret = mbedtls_internal_sha256_process(ctx, ctx->buffer)) != 0) {
            return ret;
        }

        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while (ilen >= SHA256_BLOCK_SIZE) {
        size_t processed =
            mbedtls_internal_sha256_process_many(ctx, input, ilen);
        if (processed < SHA256_BLOCK_SIZE) {
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
        }

        input += processed;
        ilen  -= processed;
    }

    if (ilen > 0) {
        memcpy((void *) (ctx->buffer + left), input, ilen);
    }

    return 0;
}